

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

int ON_MeshIsManifold_Compare3floats(void *a,void *b)

{
  float fVar1;
  float fVar2;
  float *fb;
  float *fa;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    if (0xb < uVar3) {
      return 0;
    }
    fVar1 = *(float *)((long)a + uVar3);
    fVar2 = *(float *)((long)b + uVar3);
    if (fVar1 < fVar2) {
      return -1;
    }
    if (fVar2 < fVar1) {
      return 1;
    }
    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
      if (!NAN(fVar1)) {
        return -1;
      }
      if (!NAN(fVar2)) {
        return 1;
      }
    }
    uVar3 = uVar3 + 4;
  } while( true );
}

Assistant:

static 
int ON_MeshIsManifold_Compare3floats( const void* a, const void* b )
{
  // NOPE // memcmp thinks -0.0f and 0.0f are different numbers // return memcmp(a,b,sizeof(ON_3fPoint));

  const float* fa = (const float*)a;
  const float* fb = (const float*)b;
  for (const float* fa3 = fa + 3; fa < fa3; ++fa, ++fb)
  {
    const float x = *fa;
    const float y = *fb;
    if (x < y)
      return -1;
    if (x > y)
      return 1;
    if (x == y)
      continue; // neither x nor y is a nan

    // at least one of x and y is a nan
    // use convention (not a nan) < (nan) because this code must use a well ordered compare for all values.
    if (x == x)
      return -1; // x is not a nan, y is a nan
    if (y == y)
      return 1; // x is a nan, y is not a nan
  }
  return 0;
}